

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

void __thiscall crnlib::qdxt5::qdxt5(qdxt5 *this,task_pool *task_pool)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  *in_stack_ffffffffffffff80;
  clusterizer<crnlib::vec<2U,_float>_> *in_stack_ffffffffffffffb0;
  vector<crnlib::vector<unsigned_int>_> *pvVar1;
  task_pool *in_stack_ffffffffffffffb8;
  vector<crnlib::vector<unsigned_int>_> *this_00;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 3) = 100;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  qdxt5_params::qdxt5_params((qdxt5_params *)0x18aa6a);
  *(undefined4 *)(in_RDI + 0xcd) = 0;
  *(undefined4 *)((long)in_RDI + 0x66c) = 0xffffffff;
  clusterizer<crnlib::vec<2U,_float>_>::clusterizer(in_stack_ffffffffffffffb0);
  vector<crnlib::vector<unsigned_int>_>::vector
            ((vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0xdc));
  threaded_clusterizer<crnlib::vec<16U,_float>_>::threaded_clusterizer
            ((threaded_clusterizer<crnlib::vec<16U,_float>_> *)(in_RDI + 0xde),
             in_stack_ffffffffffffffb8);
  this_00 = (vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0x11c);
  pvVar1 = (vector<crnlib::vector<unsigned_int>_> *)(in_RDI + 0x31c);
  do {
    vector<crnlib::vector<unsigned_int>_>::vector(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != pvVar1);
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::hash_map(in_stack_ffffffffffffff80);
  spinlock::spinlock((spinlock *)0x18ab3f);
  return;
}

Assistant:

qdxt5::qdxt5(task_pool& task_pool)
    : m_pTask_pool(&task_pool),
      m_main_thread_id(0),
      m_canceled(false),
      m_progress_start(0),
      m_progress_range(100),
      m_num_blocks(0),
      m_pBlocks(NULL),
      m_pDst_elements(NULL),
      m_elements_per_block(0),
      m_max_selector_clusters(0),
      m_prev_percentage_complete(-1),
      m_selector_clusterizer(task_pool) {
}